

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O3

int isotree_impute(void *isotree_model,size_t nrows,uint8_t is_col_major,double *numeric_data,
                  int *categ_data,double *csr_values,int *csr_indices,int *csr_indptr)

{
  int iVar1;
  
  if (isotree_model == (void *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Passed NULL \'isotree_model\' to \'isotree_impute\'.",0x30);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    iVar1 = 1;
  }
  else {
    if (csr_indptr == (int *)0x0) {
      isotree::IsolationForest::impute
                ((IsolationForest *)isotree_model,numeric_data,categ_data,is_col_major != '\0',nrows
                );
    }
    else {
      isotree::IsolationForest::impute
                ((IsolationForest *)isotree_model,csr_values,csr_indices,csr_indptr,categ_data,
                 is_col_major != '\0',nrows);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

ISOTREE_EXPORTED
int isotree_impute
(
    void *isotree_model,
    size_t nrows,
    uint8_t is_col_major,
    double *numeric_data,
    int *categ_data,
    double *csr_values,
    int *csr_indices,
    int *csr_indptr
)
{
    if (!isotree_model) {
        cerr << "Passed NULL 'isotree_model' to 'isotree_impute'." << std::endl;
        return IsoTreeError;
    }

    IsolationForest *model = (IsolationForest*)isotree_model;

    try
    {
        if (!csr_indptr) {
            model->impute(numeric_data, categ_data, (bool) is_col_major, nrows);
        }

        else {
            model->impute(csr_values, csr_indices, csr_indptr,
                          categ_data, (bool) is_col_major, nrows);
        }

        return IsoTreeSuccess;
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
    }

    return IsoTreeError;
}